

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

uint * If_CluHashLookup(If_Man_t *p,word *pTruth,int t)

{
  char *pcVar1;
  undefined8 *puVar2;
  int nWords;
  long *plVar3;
  uint uVar4;
  int iVar5;
  Mem_Fixed_t *pMVar6;
  void **ppvVar7;
  uint *puVar8;
  void *pvVar9;
  void **ppvVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  long *plVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int local_54;
  
  if (p == (If_Man_t *)0x0) {
    puVar8 = (uint *)0x0;
  }
  else {
    iVar15 = p->pPars->nLutSize;
    nWords = 1 << ((char)iVar15 - 6U & 0x1f);
    if (iVar15 < 7) {
      nWords = 1;
    }
    if (p->pMemEntries == (Mem_Fixed_t *)0x0) {
      pMVar6 = Mem_FixedStart(nWords * 8 + 0x10);
      p->pMemEntries = pMVar6;
    }
    if (p->pHashTable[t] == (void **)0x0) {
      uVar12 = p->pPars->nCutsMax * p->vObjs->nSize - 1;
      while( true ) {
        do {
          uVar13 = uVar12 + 1;
          uVar4 = uVar12 & 1;
          uVar12 = uVar13;
        } while (uVar4 != 0);
        if (uVar13 < 9) break;
        iVar15 = 5;
        while (uVar13 % (iVar15 - 2U) != 0) {
          uVar4 = iVar15 * iVar15;
          iVar15 = iVar15 + 2;
          if (uVar13 < uVar4) goto LAB_00415238;
        }
      }
LAB_00415238:
      iVar15 = p->pPars->nLutSize;
      iVar5 = 1 << ((char)iVar15 - 6U & 0x1f);
      if (iVar15 < 7) {
        iVar5 = 1;
      }
      iVar5 = (int)((1048576000.0 / (double)iVar5) * 0.125);
      iVar15 = uVar13 * 4;
      if (iVar5 <= (int)(uVar13 * 4)) {
        iVar15 = iVar5;
      }
      uVar12 = iVar15 / 2 - 1;
      while( true ) {
        do {
          uVar13 = uVar12 + 1;
          uVar4 = uVar12 & 1;
          uVar12 = uVar13;
        } while (uVar4 != 0);
        if (uVar13 < 9) break;
        iVar15 = 5;
        while (uVar13 % (iVar15 - 2U) != 0) {
          uVar4 = iVar15 * iVar15;
          iVar15 = iVar15 + 2;
          if (uVar13 < uVar4) goto LAB_004152aa;
        }
      }
LAB_004152aa:
      p->nTableSize[t] = uVar13;
      ppvVar7 = (void **)calloc((long)(int)uVar13,8);
      p->pHashTable[t] = ppvVar7;
    }
    iVar15 = p->nTableSize[t];
    local_54 = If_CluHashKey(pTruth,nWords,iVar15);
    ppvVar7 = p->pHashTable[t] + local_54;
    while (ppvVar7 = (void **)*ppvVar7, ppvVar7 != (void **)0x0) {
      iVar5 = bcmp(ppvVar7 + 2,pTruth,(long)nWords << 3);
      if (iVar5 == 0) {
        *(int *)((long)ppvVar7 + 0xc) = *(int *)((long)ppvVar7 + 0xc) + 1;
        return (uint *)(ppvVar7 + 1);
      }
    }
    uVar12 = p->nTableEntries[t];
    if (iVar15 * 2 <= (int)uVar12) {
      puVar8 = (uint *)malloc(0x10);
      uVar4 = 8;
      if (6 < uVar12 - 1) {
        uVar4 = uVar12;
      }
      puVar8[1] = 0;
      *puVar8 = uVar4;
      if (uVar4 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc((long)(int)uVar4 << 3);
      }
      *(void **)(puVar8 + 2) = pvVar9;
      iVar5 = If_CluHashFindMedian(p,t);
      iVar15 = p->nTableSize[t];
      if (0 < iVar15) {
        lVar16 = 0;
        do {
          pcVar11 = (char *)p->pHashTable[t][lVar16];
          while (pcVar11 != (char *)0x0) {
            if (iVar5 < *(int *)(pcVar11 + 0xc)) {
              uVar12 = puVar8[1];
              uVar4 = *puVar8;
              if (uVar12 == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (*(void **)(puVar8 + 2) == (void *)0x0) {
                    pvVar9 = malloc(0x80);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(puVar8 + 2),0x80);
                  }
                  uVar13 = 0x10;
                }
                else {
                  uVar13 = uVar4 * 2;
                  if ((int)uVar13 <= (int)uVar4) goto LAB_00415453;
                  if (*(void **)(puVar8 + 2) == (void *)0x0) {
                    pvVar9 = malloc((ulong)uVar4 << 4);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(puVar8 + 2),(ulong)uVar4 << 4);
                  }
                }
                *(void **)(puVar8 + 2) = pvVar9;
                *puVar8 = uVar13;
              }
LAB_00415453:
              puVar8[1] = uVar12 + 1;
              *(char **)(*(long *)(puVar8 + 2) + (long)(int)uVar12 * 8) = pcVar11;
              pcVar11 = *(char **)pcVar11;
            }
            else {
              pcVar1 = *(char **)pcVar11;
              Mem_FixedEntryRecycle(p->pMemEntries,pcVar11);
              pcVar11 = pcVar1;
            }
          }
          lVar16 = lVar16 + 1;
          iVar15 = p->nTableSize[t];
        } while (lVar16 < iVar15);
      }
      memset(p->pHashTable[t],0,(long)iVar15 << 3);
      uVar12 = puVar8[1];
      if (0 < (long)(int)uVar12) {
        lVar16 = *(long *)(puVar8 + 2);
        iVar15 = p->nTableSize[t];
        lVar17 = 0;
        do {
          puVar2 = *(undefined8 **)(lVar16 + lVar17 * 8);
          local_54 = If_CluHashKey(puVar2 + 2,nWords,iVar15);
          ppvVar7 = (void **)p->pHashTable[t][local_54];
          if ((ppvVar7 == (void **)0x0) ||
             (*(uint *)((long)ppvVar7 + 0xc) <= *(uint *)((long)puVar2 + 0xc))) {
            *puVar2 = ppvVar7;
            ppvVar10 = p->pHashTable[t] + local_54;
          }
          else {
            do {
              ppvVar10 = ppvVar7;
              ppvVar7 = (void **)*ppvVar10;
              if (ppvVar7 == (void **)0x0) break;
            } while (*(uint *)((long)puVar2 + 0xc) < *(uint *)((long)ppvVar7 + 0xc));
            *puVar2 = ppvVar7;
          }
          *ppvVar10 = puVar2;
          lVar17 = lVar17 + 1;
        } while (lVar17 != (int)uVar12);
      }
      p->nTableEntries[t] = uVar12;
      if (*(void **)(puVar8 + 2) != (void *)0x0) {
        free(*(void **)(puVar8 + 2));
        puVar8[2] = 0;
        puVar8[3] = 0;
      }
      free(puVar8);
    }
    p->nTableEntries[t] = p->nTableEntries[t] + 1;
    pcVar11 = Mem_FixedEntryFetch(p->pMemEntries);
    memcpy(pcVar11 + 0x10,pTruth,(long)nWords << 3);
    puVar8 = (uint *)(pcVar11 + 8);
    pcVar11[8] = -1;
    pcVar11[9] = '\0';
    pcVar11[10] = '\0';
    pcVar11[0xb] = '\0';
    pcVar11[0xc] = '\x01';
    pcVar11[0xd] = '\0';
    pcVar11[0xe] = '\0';
    pcVar11[0xf] = '\0';
    pcVar11[0] = '\0';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    pcVar11[4] = '\0';
    pcVar11[5] = '\0';
    pcVar11[6] = '\0';
    pcVar11[7] = '\0';
    plVar3 = (long *)p->pHashTable[t][local_54];
    do {
      plVar14 = plVar3;
      if (plVar14 == (long *)0x0) {
        p->pHashTable[t][local_54] = pcVar11;
        return puVar8;
      }
      plVar3 = (long *)*plVar14;
    } while ((long *)*plVar14 != (long *)0x0);
    *plVar14 = (long)pcVar11;
  }
  return puVar8;
}

Assistant:

unsigned * If_CluHashLookup( If_Man_t * p, word * pTruth, int t )
{
    If_Hte_t * pEntry, * pPrev;
    int nWords, HashKey;
    if ( p == NULL )
        return NULL;
    nWords = If_CluWordNum(p->pPars->nLutSize);
    if ( p->pMemEntries == NULL )
        p->pMemEntries = Mem_FixedStart( sizeof(If_Hte_t) + sizeof(word) * (If_CluWordNum(p->pPars->nLutSize) - 1) );
    if ( p->pHashTable[t] == NULL )
    {
        // decide how large should be the table
        int nEntriesMax1 = 4 * If_CluPrimeCudd( Vec_PtrSize(p->vObjs) * p->pPars->nCutsMax );
        int nEntriesMax2 = (int)(((double)CLU_MEM_MAX * (1 << 20)) / If_CluWordNum(p->pPars->nLutSize) / 8);
//        int nEntriesMax2 = 10000;
        // create table
        p->nTableSize[t] = If_CluPrimeCudd( Abc_MinInt(nEntriesMax1, nEntriesMax2)/2 );
        p->pHashTable[t] = ABC_CALLOC( void *, p->nTableSize[t] );
    }
    // check if this entry exists
    HashKey = If_CluHashKey( pTruth, nWords, p->nTableSize[t] );
    for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pEntry; pEntry = pEntry->pNext )
        if ( memcmp(pEntry->pTruth, pTruth, sizeof(word) * nWords) == 0 )
        {
            pEntry->Counter++;
            return &pEntry->Group;
        }
    // resize the hash table
    if ( p->nTableEntries[t] >= 2 * p->nTableSize[t] )
    {
        // collect useful entries
        If_Hte_t * pPrev;
        Vec_Ptr_t * vUseful = Vec_PtrAlloc( p->nTableEntries[t] );
        int i, Median = If_CluHashFindMedian( p, t );
        for ( i = 0; i < p->nTableSize[t]; i++ )
        {
            for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; )
            {
                if ( (int)pEntry->Counter > Median )
                {
                    Vec_PtrPush( vUseful, pEntry );
                    pEntry = pEntry->pNext;
                }
                else
                {
                    pPrev = pEntry->pNext;
                    Mem_FixedEntryRecycle( p->pMemEntries, (char *)pEntry );
                    pEntry = pPrev;
                }
            }
        }
        // add useful entries
        memset( p->pHashTable[t], 0, sizeof(void *) * p->nTableSize[t] );
        Vec_PtrForEachEntry( If_Hte_t *, vUseful, pEntry, i )
        {
            HashKey = If_CluHashKey( pEntry->pTruth, nWords, p->nTableSize[t] );
            pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey];
            if ( pPrev == NULL || pEntry->Counter >= pPrev->Counter )
            {
                pEntry->pNext = pPrev;
                ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
            }
            else
            {
                while ( pPrev->pNext && pEntry->Counter < pPrev->pNext->Counter )
                    pPrev = pPrev->pNext;
                pEntry->pNext = pPrev->pNext;
                pPrev->pNext = pEntry;
            }
        }
        p->nTableEntries[t] = Vec_PtrSize( vUseful );
        Vec_PtrFree( vUseful );
    }
    // create entry
    p->nTableEntries[t]++;
    pEntry = (If_Hte_t *)Mem_FixedEntryFetch( p->pMemEntries );
    memcpy( pEntry->pTruth, pTruth, sizeof(word) * nWords );
    pEntry->Group = CLU_UNUSED;
    pEntry->Counter = 1;
    // insert at the beginning
//    pEntry->pNext = ((If_Hte_t **)p->pHashTable[t])[HashKey];
//    ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    // insert at the end
    pEntry->pNext = NULL;
    for ( pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pPrev && pPrev->pNext; pPrev = pPrev->pNext );
    if ( pPrev == NULL )
        ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    else
        pPrev->pNext = pEntry;
    return &pEntry->Group;
}